

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup3.c
# Opt level: O0

uint32_t hashword(uint32_t *k,size_t length,uint32_t initval)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint local_28;
  uint local_24;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  uint32_t initval_local;
  size_t length_local;
  uint32_t *k_local;
  
  local_28 = (int)length * 4 + -0x21524111 + initval;
  local_24 = local_28;
  c = local_28;
  length_local = (size_t)k;
  for (_a = length; 3 < _a; _a = _a - 3) {
    iVar1 = *(int *)(length_local + 4) + local_24;
    local_28 = *(int *)(length_local + 8) + local_28;
    uVar2 = (local_28 * 0x10 | local_28 >> 0x1c) ^ (*(int *)length_local + c) - local_28;
    iVar3 = iVar1 + local_28;
    uVar4 = (uVar2 << 6 | uVar2 >> 0x1a) ^ iVar1 - uVar2;
    iVar1 = iVar3 + uVar2;
    uVar2 = (uVar4 << 8 | uVar4 >> 0x18) ^ iVar3 - uVar4;
    iVar3 = iVar1 + uVar4;
    uVar4 = (uVar2 << 0x10 | uVar2 >> 0x10) ^ iVar1 - uVar2;
    iVar1 = iVar3 + uVar2;
    local_24 = (uVar4 << 0x13 | uVar4 >> 0xd) ^ iVar3 - uVar4;
    c = iVar1 + uVar4;
    local_28 = (local_24 << 4 | local_24 >> 0x1c) ^ iVar1 - local_24;
    local_24 = c + local_24;
    length_local = length_local + 0xc;
  }
  switch(_a) {
  case 0:
    return local_28;
  case 3:
    local_28 = *(int *)(length_local + 8) + local_28;
  case 2:
    local_24 = *(int *)(length_local + 4) + local_24;
  case 1:
    uVar2 = (local_24 ^ local_28) - (local_24 << 0xe | local_24 >> 0x12);
    uVar4 = (uVar2 ^ *(int *)length_local + c) - (uVar2 * 0x800 | uVar2 >> 0x15);
    uVar5 = (uVar4 ^ local_24) - (uVar4 * 0x2000000 | uVar4 >> 7);
    uVar2 = (uVar5 ^ uVar2) - (uVar5 * 0x10000 | uVar5 >> 0x10);
    uVar4 = (uVar2 ^ uVar4) - (uVar2 * 0x10 | uVar2 >> 0x1c);
    uVar4 = (uVar4 ^ uVar5) - (uVar4 * 0x4000 | uVar4 >> 0x12);
    return (uVar4 ^ uVar2) - (uVar4 * 0x1000000 | uVar4 >> 8);
  default:
    return local_28;
  }
}

Assistant:

uint32_t hashword(
const uint32_t *k,                   /* the key, an array of uint32_t values */
size_t          length,               /* the length of the key, in uint32_ts */
uint32_t        initval)         /* the previous hash, or an arbitrary value */
{
  uint32_t a,b,c;

  /* Set up the internal state */
  a = b = c = 0xdeadbeef + (((uint32_t)length)<<2) + initval;

  /*------------------------------------------------- handle most of the key */
  while (length > 3)
  {
    a += k[0];
    b += k[1];
    c += k[2];
    mix(a,b,c);
    length -= 3;
    k += 3;
  }

  /*------------------------------------------- handle the last 3 uint32_t's */
  switch(length)                     /* all the case statements fall through */
  {
  case 3 : c+=k[2];
  case 2 : b+=k[1];
  case 1 : a+=k[0];
    final(a,b,c);
  case 0:     /* case 0: nothing left to add */
    break;
  }
  /*------------------------------------------------------ report the result */
  return c;
}